

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O1

int intersectRectQuad2(cbtScalar *h,cbtScalar *p,cbtScalar *ret)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  cbtScalar *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  cbtScalar *pcVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  cbtScalar *pcVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 in_register_00001384 [12];
  cbtScalar buffer [16];
  cbtScalar *local_90;
  cbtScalar local_78 [18];
  
  uVar8 = 4;
  uVar4 = 0;
  local_90 = ret;
  do {
    uVar10 = uVar4 & 0xffffffff ^ 1;
    iVar11 = -1;
    do {
      uVar6 = 0;
      if ((int)uVar8 < 1) {
        iVar12 = 8;
      }
      else {
        auVar15._0_4_ = (float)iVar11;
        auVar15._4_12_ = in_register_00001384;
        iVar7 = uVar8 + 1;
        uVar6 = 0;
        pcVar5 = p;
        pcVar13 = local_90;
        do {
          if (auVar15._0_4_ * pcVar5[uVar4] < h[uVar4]) {
            *pcVar13 = *pcVar5;
            pcVar13[1] = pcVar5[1];
            uVar6 = uVar6 + 1;
            if ((uVar6 & 8) != 0) {
              iVar12 = 0xb;
              p = local_90;
              goto LAB_008ea8a3;
            }
            pcVar13 = pcVar13 + 2;
          }
          pcVar9 = pcVar5 + 2;
          if (iVar7 == 2) {
            pcVar9 = p;
          }
          fVar1 = pcVar5[uVar4];
          fVar2 = h[uVar4];
          bVar14 = true;
          if (fVar1 * auVar15._0_4_ < fVar2 == pcVar9[uVar4] * auVar15._0_4_ < fVar2) {
LAB_008ea868:
            iVar12 = 0;
            pcVar5 = pcVar5 + 2;
          }
          else {
            auVar3 = vfmsub213ss_fma(ZEXT416((uint)fVar2),auVar15,ZEXT416((uint)fVar1));
            auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)((pcVar9[uVar10] - pcVar5[uVar10]) /
                                                          (pcVar9[uVar4] - fVar1))),
                                     ZEXT416((uint)pcVar5[uVar10]));
            pcVar13[uVar10] = auVar3._0_4_;
            pcVar13[uVar4] = auVar15._0_4_ * h[uVar4];
            pcVar13 = pcVar13 + 2;
            uVar6 = uVar6 + 1;
            if ((uVar6 & 8) == 0) goto LAB_008ea868;
            iVar12 = 0xb;
            bVar14 = false;
            p = local_90;
          }
          if (!bVar14) goto LAB_008ea8a3;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
        iVar12 = 8;
      }
LAB_008ea8a3:
      if (iVar12 == 8) {
        pcVar5 = ret;
        if (local_90 == ret) {
          pcVar5 = local_78;
        }
        iVar12 = 0;
        p = local_90;
        local_90 = pcVar5;
        uVar8 = uVar6;
      }
      if (iVar12 != 0) goto LAB_008ea8e9;
      bVar14 = iVar11 < 0;
      iVar11 = iVar11 + 2;
    } while (bVar14);
    iVar12 = 5;
LAB_008ea8e9:
    if (iVar12 != 5) goto LAB_008ea905;
    bVar14 = uVar4 == 0;
    uVar4 = uVar4 + 1;
  } while (bVar14);
  iVar12 = 2;
LAB_008ea905:
  if (((iVar12 == 0xb) || (iVar12 == 2)) && (p != ret)) {
    memcpy(ret,p,(long)(int)(uVar6 * 2) << 2);
  }
  return uVar6;
}

Assistant:

static int intersectRectQuad2(cbtScalar h[2], cbtScalar p[8], cbtScalar ret[16])
{
	// q (and r) contain nq (and nr) coordinate points for the current (and
	// chopped) polygons
	int nq = 4, nr = 0;
	cbtScalar buffer[16];
	cbtScalar* q = p;
	cbtScalar* r = ret;
	for (int dir = 0; dir <= 1; dir++)
	{
		// direction notation: xy[0] = x axis, xy[1] = y axis
		for (int sign = -1; sign <= 1; sign += 2)
		{
			// chop q along the line xy[dir] = sign*h[dir]
			cbtScalar* pq = q;
			cbtScalar* pr = r;
			nr = 0;
			for (int i = nq; i > 0; i--)
			{
				// go through all points in q and all lines between adjacent points
				if (sign * pq[dir] < h[dir])
				{
					// this point is inside the chopping line
					pr[0] = pq[0];
					pr[1] = pq[1];
					pr += 2;
					nr++;
					if (nr & 8)
					{
						q = r;
						goto done;
					}
				}
				cbtScalar* nextq = (i > 1) ? pq + 2 : q;
				if ((sign * pq[dir] < h[dir]) ^ (sign * nextq[dir] < h[dir]))
				{
					// this line crosses the chopping line
					pr[1 - dir] = pq[1 - dir] + (nextq[1 - dir] - pq[1 - dir]) /
													(nextq[dir] - pq[dir]) * (sign * h[dir] - pq[dir]);
					pr[dir] = sign * h[dir];
					pr += 2;
					nr++;
					if (nr & 8)
					{
						q = r;
						goto done;
					}
				}
				pq += 2;
			}
			q = r;
			r = (q == ret) ? buffer : ret;
			nq = nr;
		}
	}
done:
	if (q != ret) memcpy(ret, q, nr * 2 * sizeof(cbtScalar));
	return nr;
}